

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void DoubleSum(jx9_context *pCtx,jx9_hashmap *pMap)

{
  double local_40;
  double dv;
  double dStack_30;
  sxu32 n;
  double dSum;
  jx9_value *pObj;
  jx9_hashmap_node *pEntry;
  jx9_hashmap *pMap_local;
  jx9_context *pCtx_local;
  
  dStack_30 = 0.0;
  pObj = (jx9_value *)pMap->pFirst;
  pEntry = (jx9_hashmap_node *)pMap;
  pMap_local = (jx9_hashmap *)pCtx;
  for (dv._4_4_ = 0; dv._4_4_ < *(uint *)((long)&pEntry->xKey + 0x1c); dv._4_4_ = dv._4_4_ + 1) {
    dSum = (double)HashmapExtractNodeValue((jx9_hashmap_node *)pObj);
    if (((jx9_value *)dSum != (jx9_value *)0x0) && ((((jx9_value *)dSum)->iFlags & 0x160U) == 0)) {
      if ((((jx9_value *)dSum)->iFlags & 4U) == 0) {
        if ((((jx9_value *)dSum)->iFlags & 10U) == 0) {
          if (((((jx9_value *)dSum)->iFlags & 1U) != 0) && ((((jx9_value *)dSum)->sBlob).nByte != 0)
             ) {
            local_40 = 0.0;
            SyStrToReal((char *)(((jx9_value *)dSum)->sBlob).pBlob,
                        (((jx9_value *)dSum)->sBlob).nByte,&local_40,(char **)0x0);
            dStack_30 = local_40 + dStack_30;
          }
        }
        else {
          dStack_30 = (double)(((jx9_value *)dSum)->x).iVal + dStack_30;
        }
      }
      else {
        dStack_30 = (((jx9_value *)dSum)->x).rVal + dStack_30;
      }
    }
    pObj = *(jx9_value **)&pObj[1].iFlags;
  }
  jx9_result_double((jx9_context *)pMap_local,dStack_30);
  return;
}

Assistant:

static void DoubleSum(jx9_context *pCtx, jx9_hashmap *pMap)
{
	jx9_hashmap_node *pEntry;
	jx9_value *pObj;
	double dSum = 0;
	sxu32 n;
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		pObj = HashmapExtractNodeValue(pEntry);
		if( pObj && (pObj->iFlags & (MEMOBJ_NULL|MEMOBJ_HASHMAP|MEMOBJ_RES)) == 0){
			if( pObj->iFlags & MEMOBJ_REAL ){
				dSum += pObj->x.rVal;
			}else if( pObj->iFlags & (MEMOBJ_INT|MEMOBJ_BOOL) ){
				dSum += (double)pObj->x.iVal;
			}else if( pObj->iFlags & MEMOBJ_STRING ){
				if( SyBlobLength(&pObj->sBlob) > 0 ){
					double dv = 0;
					SyStrToReal((const char *)SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob), (void *)&dv, 0);
					dSum += dv;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Return sum */
	jx9_result_double(pCtx, dSum);
}